

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

bool __thiscall dg::llvmdg::legacy::Block::removePredecessor(Block *this,Block *predecessor)

{
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *this_00;
  size_t sVar1;
  Block *pBVar2;
  bool bVar3;
  pair<std::_Rb_tree_iterator<dg::llvmdg::legacy::Block_*>,_std::_Rb_tree_iterator<dg::llvmdg::legacy::Block_*>_>
  pVar4;
  Block *local_28;
  Block *local_20;
  
  if (predecessor == (Block *)0x0) {
    bVar3 = false;
  }
  else {
    local_28 = predecessor;
    pVar4 = std::
            _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ::equal_range(&(this->predecessors_)._M_t,&local_28);
    std::
    _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::_M_erase_aux(&(this->predecessors_)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    pBVar2 = local_28;
    this_00 = &local_28->successors_;
    local_20 = this;
    pVar4 = std::
            _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ::equal_range(&this_00->_M_t,&local_20);
    sVar1 = (pBVar2->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    bVar3 = sVar1 != (pBVar2->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return bVar3;
}

Assistant:

bool Block::removePredecessor(Block *predecessor) {
    if (!predecessor) {
        return false;
    }
    predecessors_.erase(predecessor);
    return predecessor->successors_.erase(this);
}